

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

void ImDrawList_PushClipRect
               (ImDrawList *self,ImVec2 clip_rect_min,ImVec2 clip_rect_max,
               bool intersect_with_current_clip_rect)

{
  bool intersect_with_current_clip_rect_local;
  ImDrawList *self_local;
  ImVec2 clip_rect_max_local;
  ImVec2 clip_rect_min_local;
  
  ImDrawList::PushClipRect(self,clip_rect_min,clip_rect_max,intersect_with_current_clip_rect);
  return;
}

Assistant:

CIMGUI_API void _ImDrawList_PushClipRect (ImDrawList *larg1, ImVec2 *larg2, ImVec2 *larg3, int larg4) {
  ImDrawList *arg1 = (ImDrawList *) 0 ;
  ImVec2 arg2 ;
  ImVec2 arg3 ;
  bool arg4 ;
  
  arg1 = larg1;
  arg2 = *larg2;
  arg3 = *larg3;
  arg4 = (bool)larg4;
  try {
    ImDrawList_PushClipRect(arg1,arg2,arg3,arg4);
    
  } catch (...) {
    
  }
}